

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

bool __thiscall FBehavior::Init(FBehavior *this,int lumpnum,FileReader *fr,int len)

{
  BYTE BVar1;
  FBehavior *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  DWORD DVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ACSProfileInfo *pAVar12;
  ulong *puVar13;
  ArrayInfo *pAVar14;
  SDWORD *pSVar15;
  ArrayInfo **ppAVar16;
  FBehavior **ppFVar17;
  ScriptFunction *pSVar18;
  BYTE *pBVar19;
  uint *arrayname;
  ACSFormat AVar20;
  ScriptFunction *pSVar21;
  ulong uVar22;
  ScriptFunction *local_200;
  ACSProfileInfo *local_1c8;
  int impNum_1;
  DWORD expectedSize;
  DWORD varNum_1;
  DWORD j_5;
  char *parse_2;
  int impNum;
  DWORD varNum;
  DWORD j_4;
  char *parse_1;
  ScriptFunction *realfunc;
  int libfunc;
  ScriptFunction *func_1;
  int j_3;
  FBehavior *lib;
  FBehavior *pFStack_128;
  int lump;
  FBehavior *module;
  BYTE *pBStack_118;
  DWORD i_3;
  char *parse;
  char *str_2;
  uint *puStack_100;
  int j_2;
  SDWORD *elems_2;
  int *piStack_f0;
  int arraynum_2;
  BYTE *chunkData;
  char *str_1;
  DWORD *pDStack_d8;
  int j_1;
  SDWORD *elems_1;
  int arraynum_1;
  DWORD i_2;
  char *str;
  DWORD i_1;
  uint j;
  SDWORD *elems;
  uint local_a8;
  uint initsize;
  int arraynum;
  int firstvar;
  int numvars;
  ScriptFunction *func;
  uint func_num;
  int size;
  ScriptFunction *funcm;
  ScriptFunctionInFile *funcf;
  BYTE *local_68;
  BYTE *funcs;
  DWORD *chunk;
  BYTE *strings;
  DWORD pretag;
  DWORD dirofs;
  int local_3c;
  BYTE *pBStack_38;
  int i;
  BYTE *object;
  FileReader *pFStack_28;
  int len_local;
  FileReader *fr_local;
  FBehavior *pFStack_18;
  int lumpnum_local;
  FBehavior *this_local;
  
  this->LumpNum = lumpnum;
  object._4_4_ = len;
  pFStack_28 = fr;
  fr_local._4_4_ = lumpnum;
  pFStack_18 = this;
  if (fr == (FileReader *)0x0) {
    object._4_4_ = FWadCollection::LumpLength(&Wads,lumpnum);
  }
  if (object._4_4_ < 0x20) {
    this_local._7_1_ = false;
  }
  else {
    pBStack_38 = (BYTE *)operator_new__((long)object._4_4_);
    if (pFStack_28 == (FileReader *)0x0) {
      FWadCollection::ReadLump(&Wads,fr_local._4_4_,pBStack_38);
    }
    else {
      (*(pFStack_28->super_FileReaderBase)._vptr_FileReaderBase[2])
                (pFStack_28,pBStack_38,(long)object._4_4_);
    }
    if (((*pBStack_38 == 'A') && (pBStack_38[1] == 'C')) && (pBStack_38[2] == 'S')) {
      BVar1 = pBStack_38[3];
      if (BVar1 == '\0') {
        this->Format = ACS_Old;
      }
      else if (BVar1 == 'E') {
        this->Format = ACS_Enhanced;
      }
      else {
        if (BVar1 != 'e') {
          if (pBStack_38 != (BYTE *)0x0) {
            operator_delete__(pBStack_38);
          }
          return false;
        }
        this->Format = ACS_LittleEnhanced;
      }
      _pretag = this;
      uVar6 = TArray<FBehavior_*,_FBehavior_*>::Push(&StaticModules,(FBehavior **)&pretag);
      this->LibraryID = uVar6 << 0x14;
      if (pFStack_28 == (FileReader *)0x0) {
        FWadCollection::GetLumpName(&Wads,this->ModuleName,fr_local._4_4_);
        this->ModuleName[8] = '\0';
      }
      else {
        strcpy(this->ModuleName,"BEHAVIOR");
      }
      this->Data = pBStack_38;
      this->DataSize = object._4_4_;
      if (this->Format == ACS_Old) {
        strings._4_4_ = *(uint *)(pBStack_38 + 4);
        strings._0_4_ = *(int *)(pBStack_38 + ((ulong)strings._4_4_ - 4));
        this->Chunks = pBStack_38 + object._4_4_;
        if ((0x17 < strings._4_4_) && (((int)strings == 0x65534341 || ((int)strings == 0x45534341)))
           ) {
          AVar20 = ACS_Enhanced;
          if ((int)strings == 0x65534341) {
            AVar20 = ACS_LittleEnhanced;
          }
          this->Format = AVar20;
          this->Chunks = pBStack_38 + *(uint *)(pBStack_38 + ((ulong)strings._4_4_ - 8));
          this->DataSize = *(int *)(pBStack_38 + 4) + -8;
        }
      }
      else {
        this->Chunks = pBStack_38 + *(uint *)(pBStack_38 + 4);
      }
      LoadScriptsDirectory(this);
      if (this->Format == ACS_Old) {
        this->StringTable = *(DWORD *)(this->Data + 4);
        this->StringTable = *(int *)(this->Data + this->StringTable) * 0xc + 4 + this->StringTable;
        UnescapeStringTable(this,this->Data + this->StringTable,this->Data,false);
      }
      else {
        UnencryptStrings(this);
        chunk = (DWORD *)FindChunk(this,0x4c525453);
        if (chunk == (DWORD *)0x0) {
          this->StringTable = 0;
        }
        else {
          this->StringTable = ((int)chunk - (int)this->Data) + 8;
          UnescapeStringTable(this,(BYTE *)(chunk + 2),(BYTE *)0x0,true);
        }
      }
      if (this->Format == ACS_Old) {
        for (local_3c = 0; local_3c < 0x80; local_3c = local_3c + 1) {
          this->MapVars[local_3c] = this->MapVarStore + local_3c;
        }
      }
      else {
        this->Functions = (ScriptFunction *)0x0;
        local_68 = FindChunk(this,0x434e5546);
        if (local_68 != (BYTE *)0x0) {
          this->NumFunctions = *(uint *)(local_68 + 4) >> 3;
          local_68 = local_68 + 8;
          uVar10 = (ulong)this->NumFunctions;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar10;
          uVar11 = SUB168(auVar2 * ZEXT816(0x18),0);
          if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
            uVar11 = 0xffffffffffffffff;
          }
          pAVar12 = (ACSProfileInfo *)operator_new__(uVar11);
          if (uVar10 != 0) {
            local_1c8 = pAVar12;
            do {
              ACSProfileInfo::ACSProfileInfo(local_1c8);
              local_1c8 = local_1c8 + 1;
            } while (local_1c8 != pAVar12 + uVar10);
          }
          this->FunctionProfileData = pAVar12;
          uVar10 = (ulong)this->NumFunctions;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar10;
          uVar11 = SUB168(auVar3 * ZEXT816(0x20),0);
          uVar22 = uVar11 + 8;
          if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar11) {
            uVar22 = 0xffffffffffffffff;
          }
          puVar13 = (ulong *)operator_new__(uVar22);
          *puVar13 = uVar10;
          pSVar21 = (ScriptFunction *)(puVar13 + 1);
          if (uVar10 != 0) {
            local_200 = pSVar21;
            do {
              ScriptFunction::ScriptFunction(local_200);
              local_200 = local_200 + 1;
            } while (local_200 != pSVar21 + uVar10);
          }
          this->Functions = pSVar21;
          for (local_3c = 0; local_3c < this->NumFunctions; local_3c = local_3c + 1) {
            funcm = (ScriptFunction *)(local_68 + (long)local_3c * 8);
            _func_num = this->Functions + local_3c;
            _func_num->ArgCount = funcm->ArgCount;
            _func_num->HasReturnValue = funcm->ImportNum;
            _func_num->ImportNum = funcm->field_0x3;
            _func_num->LocalCount = (uint)funcm->HasReturnValue;
            _func_num->Address = funcm->LocalCount;
          }
        }
        if (0 < this->NumFunctions) {
          for (funcs = FindChunk(this,0x59524146); funcs != (BYTE *)0x0;
              funcs = NextChunk(this,funcs)) {
            func._4_4_ = *(int *)(funcs + 4);
            if ((5 < func._4_4_) &&
               (func._0_4_ = (uint)*(ushort *)(funcs + 8), (uint)func < (uint)this->NumFunctions)) {
              _numvars = this->Functions + (uint)func;
              iVar7 = ParseLocalArrayChunk
                                (funcs,&_numvars->LocalArrays,
                                 _numvars->LocalCount + (uint)_numvars->ArgCount);
              _numvars->LocalCount = iVar7 - (uint)_numvars->ArgCount;
            }
          }
        }
        funcs = FindChunk(this,0x504d554a);
        if (funcs != (BYTE *)0x0) {
          for (local_3c = 0; local_3c < *(int *)(funcs + 4); local_3c = local_3c + 4) {
            firstvar = *(int *)(funcs + (long)(local_3c / 4 + 2) * 4);
            TArray<int,_int>::Push(&this->JumpPoints,&firstvar);
          }
        }
        memset(this->MapVarStore,0,0x200);
        for (funcs = FindChunk(this,0x494e494d); funcs != (BYTE *)0x0; funcs = NextChunk(this,funcs)
            ) {
          arraynum = (*(uint *)(funcs + 4) >> 2) - 1;
          initsize = *(uint *)(funcs + 8);
          for (local_3c = 0; local_3c < arraynum; local_3c = local_3c + 1) {
            this->MapVarStore[(int)(local_3c + initsize)] =
                 *(SDWORD *)(funcs + (long)(local_3c + 3) * 4);
          }
        }
        for (local_3c = 0; local_3c < 0x80; local_3c = local_3c + 1) {
          this->MapVars[local_3c] = this->MapVarStore + local_3c;
        }
        funcs = FindChunk(this,0x59415241);
        if (funcs != (BYTE *)0x0) {
          this->NumArrays = *(uint *)(funcs + 4) >> 3;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (long)this->NumArrays;
          uVar10 = SUB168(auVar4 * ZEXT816(0x10),0);
          if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
            uVar10 = 0xffffffffffffffff;
          }
          pAVar14 = (ArrayInfo *)operator_new__(uVar10);
          this->ArrayStore = pAVar14;
          memset(this->ArrayStore,0,(long)this->NumArrays << 3);
          for (local_3c = 0; local_3c < this->NumArrays; local_3c = local_3c + 1) {
            this->MapVarStore[*(uint *)(funcs + (long)(local_3c * 2 + 2) * 4)] = local_3c;
            this->ArrayStore[local_3c].ArraySize = *(DWORD *)(funcs + (long)(local_3c * 2 + 3) * 4);
            auVar2 = ZEXT416(this->ArrayStore[local_3c].ArraySize) * ZEXT816(4);
            uVar10 = auVar2._0_8_;
            if (auVar2._8_8_ != 0) {
              uVar10 = 0xffffffffffffffff;
            }
            pSVar15 = (SDWORD *)operator_new__(uVar10);
            this->ArrayStore[local_3c].Elements = pSVar15;
            memset(this->ArrayStore[local_3c].Elements,0,
                   (ulong)this->ArrayStore[local_3c].ArraySize << 2);
          }
        }
        for (funcs = FindChunk(this,0x494e4941); funcs != (BYTE *)0x0; funcs = NextChunk(this,funcs)
            ) {
          local_a8 = this->MapVarStore[*(uint *)(funcs + 8)];
          if (local_a8 < (uint)this->NumArrays) {
            elems._4_4_ = MIN<unsigned_int>(this->ArrayStore[(int)local_a8].ArraySize,
                                            *(int *)(funcs + 4) - 4U >> 2);
            _i_1 = this->ArrayStore[(int)local_a8].Elements;
            for (str._4_4_ = 0; str._4_4_ < elems._4_4_; str._4_4_ = str._4_4_ + 1) {
              _i_1[str._4_4_] = *(SDWORD *)(funcs + (ulong)(str._4_4_ + 3) * 4);
            }
          }
        }
        this->NumTotalArrays = this->NumArrays;
        funcs = FindChunk(this,0x504d4941);
        if (funcs != (BYTE *)0x0) {
          this->NumTotalArrays = *(int *)(funcs + 8) + this->NumTotalArrays;
        }
        if (this->NumTotalArrays != 0) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (long)this->NumTotalArrays;
          uVar10 = SUB168(auVar5 * ZEXT816(8),0);
          if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
            uVar10 = 0xffffffffffffffff;
          }
          ppAVar16 = (ArrayInfo **)operator_new__(uVar10);
          this->Arrays = ppAVar16;
          for (local_3c = 0; local_3c < this->NumArrays; local_3c = local_3c + 1) {
            this->Arrays[local_3c] = this->ArrayStore + local_3c;
          }
        }
        if (this->LibraryID != 0) {
          funcs = FindChunk(this,0x5254534d);
          if (funcs != (BYTE *)0x0) {
            for (str._0_4_ = 0; (uint)str < *(uint *)(funcs + 4) >> 2; str._0_4_ = (uint)str + 1) {
              _arraynum_1 = LookupString(this,this->MapVarStore
                                              [*(uint *)(funcs + (ulong)((uint)str + 2) * 4)]);
              if (_arraynum_1 != (char *)0x0) {
                iVar7 = ACSStringPool::AddString(&GlobalACSStrings,_arraynum_1);
                this->MapVarStore[*(uint *)(funcs + (ulong)((uint)str + 2) * 4)] = iVar7;
              }
            }
          }
          funcs = FindChunk(this,0x52545341);
          if (funcs != (BYTE *)0x0) {
            for (elems_1._4_4_ = 0; elems_1._4_4_ < *(uint *)(funcs + 4) >> 2;
                elems_1._4_4_ = elems_1._4_4_ + 1) {
              elems_1._0_4_ = this->MapVarStore[*(uint *)(funcs + (ulong)(elems_1._4_4_ + 2) * 4)];
              if ((uint)elems_1 < (uint)this->NumArrays) {
                pDStack_d8 = (DWORD *)this->ArrayStore[(int)(uint)elems_1].Elements;
                for (str_1._4_4_ = this->ArrayStore[(int)(uint)elems_1].ArraySize;
                    0 < (int)str_1._4_4_; str_1._4_4_ = str_1._4_4_ - 1) {
                  chunkData = (BYTE *)LookupString(this,*pDStack_d8);
                  if (chunkData != (BYTE *)0x0) {
                    DVar8 = ACSStringPool::AddString(&GlobalACSStrings,(char *)chunkData);
                    *pDStack_d8 = DVar8;
                  }
                  pDStack_d8 = pDStack_d8 + 1;
                }
              }
            }
          }
          for (funcs = FindChunk(this,0x47415441); funcs != (BYTE *)0x0;
              funcs = NextChunk(this,funcs)) {
            piStack_f0 = (int *)(funcs + 9);
            if (funcs[8] == '\0') {
              iVar7 = uallong(piStack_f0);
              elems_2._4_4_ = this->MapVarStore[iVar7];
              piStack_f0 = piStack_f0 + 1;
              if (elems_2._4_4_ < (uint)this->NumArrays) {
                puStack_100 = (uint *)this->ArrayStore[(int)elems_2._4_4_].Elements;
                for (str_2._4_4_ = MIN<unsigned_int>(*(int *)(funcs + 4) - 5,
                                                     this->ArrayStore[(int)elems_2._4_4_].ArraySize)
                    ; 0 < (int)str_2._4_4_; str_2._4_4_ = str_2._4_4_ - 1) {
                  if ((char)*piStack_f0 == '\x02') {
                    *puStack_100 = this->LibraryID | *puStack_100;
                  }
                  else if (((char)*piStack_f0 == '\x01') &&
                          (parse = LookupString(this,*puStack_100), parse != (char *)0x0)) {
                    uVar6 = ACSStringPool::AddString(&GlobalACSStrings,parse);
                    *puStack_100 = uVar6;
                  }
                  puStack_100 = puStack_100 + 1;
                  piStack_f0 = (int *)((long)piStack_f0 + 1);
                }
              }
            }
          }
        }
        funcs = FindChunk(this,0x44414f4c);
        if (funcs != (BYTE *)0x0) {
          pBStack_118 = funcs + 8;
          for (module._4_4_ = 0; module._4_4_ < *(uint *)(funcs + 4);
              module._4_4_ = module._4_4_ + 1) {
            if (pBStack_118[module._4_4_] != '\0') {
              pFStack_128 = (FBehavior *)0x0;
              iVar7 = FWadCollection::CheckNumForName(&Wads,(char *)(pBStack_118 + module._4_4_),4);
              if (iVar7 < 0) {
                Printf("\x1cGCould not find ACS library %s.\n",pBStack_118 + module._4_4_);
              }
              else {
                pFStack_128 = StaticLoadModule(iVar7,(FileReader *)0x0,0);
              }
              if (pFStack_128 != (FBehavior *)0x0) {
                TArray<FBehavior_*,_FBehavior_*>::Push(&this->Imports,&stack0xfffffffffffffed8);
              }
              do {
                module._4_4_ = module._4_4_ + 1;
              } while (pBStack_118[module._4_4_] != '\0');
            }
          }
          for (module._4_4_ = 0; uVar6 = module._4_4_,
              uVar9 = TArray<FBehavior_*,_FBehavior_*>::Size(&this->Imports), uVar6 < uVar9;
              module._4_4_ = module._4_4_ + 1) {
            ppFVar17 = TArray<FBehavior_*,_FBehavior_*>::operator[]
                                 (&this->Imports,(ulong)module._4_4_);
            this_00 = *ppFVar17;
            if (this_00 != (FBehavior *)0x0) {
              funcs = FindChunk(this,0x4d414e46);
              for (func_1._4_4_ = 0; func_1._4_4_ < this->NumFunctions;
                  func_1._4_4_ = func_1._4_4_ + 1) {
                pSVar21 = this->Functions + func_1._4_4_;
                if ((((pSVar21->Address == 0) && (pSVar21->ImportNum == '\0')) &&
                    (DVar8 = FindFunctionName(this_00,(char *)(funcs + (ulong)*(uint *)(funcs + (
                                                  long)(func_1._4_4_ + 3) * 4) + 8)),
                    -1 < (int)DVar8)) &&
                   ((pSVar18 = this_00->Functions + (int)DVar8, pSVar18->Address != 0 &&
                    (pSVar18->ImportNum == '\0')))) {
                  pSVar21->Address = DVar8;
                  pSVar21->ImportNum = (char)module._4_4_ + '\x01';
                  if (pSVar18->ArgCount != pSVar21->ArgCount) {
                    Printf("\x1cIFunction %s in %s has %d arguments. %s expects it to have %d.\n",
                           funcs + (ulong)*(uint *)(funcs + (long)(func_1._4_4_ + 3) * 4) + 8,
                           this_00->ModuleName,(ulong)pSVar18->ArgCount,this->ModuleName,
                           (ulong)pSVar21->ArgCount);
                    this->Format = ACS_Unknown;
                  }
                  pSVar21->LocalCount = pSVar18->LocalCount;
                  pSVar21->HasReturnValue = pSVar18->HasReturnValue;
                }
              }
              pBVar19 = FindChunk(this,0x504d494d);
              funcs = pBVar19;
              if (pBVar19 != (BYTE *)0x0) {
                for (impNum = 0; (uint)impNum < *(uint *)(funcs + 4); impNum = impNum + 2) {
                  uVar6 = *(uint *)(pBVar19 + (ulong)(uint)impNum + 8);
                  uVar9 = impNum + 4;
                  iVar7 = FindMapVarName(this_00,(char *)(pBVar19 + (ulong)uVar9 + 8));
                  if (-1 < iVar7) {
                    this->MapVars[uVar6] = this_00->MapVarStore + iVar7;
                  }
                  do {
                    impNum = uVar9;
                    uVar9 = impNum + 1U;
                  } while (pBVar19[(ulong)(impNum + 1U) + 8] != '\0');
                }
              }
              if (this->NumArrays < this->NumTotalArrays) {
                funcs = FindChunk(this,0x504d4941);
                _varNum_1 = (uint *)(funcs + 0xc);
                for (expectedSize = 0; expectedSize < *(uint *)(funcs + 8);
                    expectedSize = expectedSize + 1) {
                  uVar6 = *_varNum_1;
                  uVar9 = _varNum_1[1];
                  arrayname = _varNum_1 + 2;
                  iVar7 = FindMapArray(this_00,(char *)arrayname);
                  if (-1 < iVar7) {
                    this->Arrays[this->NumArrays + expectedSize] = this_00->ArrayStore + iVar7;
                    this->MapVarStore[uVar6] = this->NumArrays + expectedSize;
                    if (this_00->ArrayStore[iVar7].ArraySize != uVar9) {
                      this->Format = ACS_Unknown;
                      Printf("\x1cIThe array %s in %s has %u elements, but %s expects it to only have %u.\n"
                             ,arrayname,this_00->ModuleName,
                             (ulong)this_00->ArrayStore[iVar7].ArraySize,this->ModuleName,
                             (ulong)uVar9);
                    }
                  }
                  do {
                    _varNum_1 = arrayname;
                    arrayname = (uint *)((long)_varNum_1 + 1);
                  } while (*(char *)((long)_varNum_1 + 1) != '\0');
                  _varNum_1 = (uint *)((long)_varNum_1 + 2);
                }
              }
            }
          }
        }
      }
      DPrintf(3,"Loaded %d scripts, %d functions\n",(ulong)(uint)this->NumScripts,
              (ulong)(uint)this->NumFunctions);
      this_local._7_1_ = true;
    }
    else {
      if (pBStack_38 != (BYTE *)0x0) {
        operator_delete__(pBStack_38);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FBehavior::Init(int lumpnum, FileReader * fr, int len)
{
	BYTE *object;
	int i;

	LumpNum = lumpnum;

	// Now that everything is set up, record this module as being among the loaded modules.
	// We need to do this before resolving any imports, because an import might (indirectly)
	// need to resolve exports in this module. The only things that can be exported are
	// functions and map variables, which must already be present if they're exported, so
	// this is okay.

	// This must be done first for 2 reasons:
	// 1. If not, corrupt modules cause memory leaks
	// 2. Corrupt modules won't be reported when a level is being loaded if this function quits before
	//    adding it to the list.

	if (fr == NULL) len = Wads.LumpLength (lumpnum);



	// Any behaviors smaller than 32 bytes cannot possibly contain anything useful.
	// (16 bytes for a completely empty behavior + 12 bytes for one script header
	//  + 4 bytes for PCD_TERMINATE for an old-style object. A new-style object
	// has 24 bytes if it is completely empty. An empty SPTR chunk adds 8 bytes.)
	if (len < 32)
	{
		return false;
	}

	object = new BYTE[len];
	if (fr == NULL)
	{
		Wads.ReadLump (lumpnum, object);
	}
	else
	{
		fr->Read (object, len);
	}

	if (object[0] != 'A' || object[1] != 'C' || object[2] != 'S')
	{
		delete[] object;
		return false;
	}

	switch (object[3])
	{
	case 0:
		Format = ACS_Old;
		break;
	case 'E':
		Format = ACS_Enhanced;
		break;
	case 'e':
		Format = ACS_LittleEnhanced;
		break;
	default:
		delete[] object;
		return false;
	}
    LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;

	if (fr == NULL)
	{
		Wads.GetLumpName (ModuleName, lumpnum);
		ModuleName[8] = 0;
	}
	else
	{
		strcpy(ModuleName, "BEHAVIOR");
	}

	Data = object;
	DataSize = len;

	if (Format == ACS_Old)
	{
		DWORD dirofs = LittleLong(((DWORD *)object)[1]);
		DWORD pretag = ((DWORD *)(object + dirofs))[-1];

		Chunks = object + len;
		// Check for redesigned ACSE/ACSe
		if (dirofs >= 6*4 &&
			(pretag == MAKE_ID('A','C','S','e') ||
			 pretag == MAKE_ID('A','C','S','E')))
		{
			Format = (pretag == MAKE_ID('A','C','S','e')) ? ACS_LittleEnhanced : ACS_Enhanced;
			Chunks = object + LittleLong(((DWORD *)(object + dirofs))[-2]);
			// Forget about the compatibility cruft at the end of the lump
			DataSize = LittleLong(((DWORD *)object)[1]) - 8;
		}
	}
	else
	{
		Chunks = object + LittleLong(((DWORD *)object)[1]);
	}

	LoadScriptsDirectory ();

	if (Format == ACS_Old)
	{
		StringTable = LittleLong(((DWORD *)Data)[1]);
		StringTable += LittleLong(((DWORD *)(Data + StringTable))[0]) * 12 + 4;
		UnescapeStringTable(Data + StringTable, Data, false);
	}
	else
	{
		UnencryptStrings ();
		BYTE *strings = FindChunk (MAKE_ID('S','T','R','L'));
		if (strings != NULL)
		{
			StringTable = DWORD(strings - Data + 8);
			UnescapeStringTable(strings + 8, NULL, true);
		}
		else
		{
			StringTable = 0;
		}
	}

	if (Format == ACS_Old)
	{
		// Do initialization for old-style behavior lumps
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}
		//LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;
	}
	else
	{
		DWORD *chunk;

		// Load functions
		BYTE *funcs;
		Functions = NULL;
		funcs = FindChunk (MAKE_ID('F','U','N','C'));
		if (funcs != NULL)
		{
			NumFunctions = LittleLong(((DWORD *)funcs)[1]) / 8;
			funcs += 8;
			FunctionProfileData = new ACSProfileInfo[NumFunctions];
			Functions = new ScriptFunction[NumFunctions];
			for (i = 0; i < NumFunctions; ++i)
			{
				ScriptFunctionInFile *funcf = &((ScriptFunctionInFile *)funcs)[i];
				ScriptFunction *funcm = &Functions[i];
				funcm->ArgCount = funcf->ArgCount;
				funcm->HasReturnValue = funcf->HasReturnValue;
				funcm->ImportNum = funcf->ImportNum;
				funcm->LocalCount = funcf->LocalCount;
				funcm->Address = LittleLong(funcf->Address);
			}
		}

		// Load local arrays for functions
		if (NumFunctions > 0)
		{
			for (chunk = (DWORD *)FindChunk(MAKE_ID('F','A','R','Y')); chunk != NULL; chunk = (DWORD *)NextChunk((BYTE *)chunk))
			{
				int size = LittleLong(chunk[1]);
				if (size >= 6)
				{
					unsigned int func_num = LittleShort(((WORD *)chunk)[4]);
					if (func_num < (unsigned int)NumFunctions)
					{
						ScriptFunction *func = &Functions[func_num];
						// Unlike scripts, functions do not include their arg count in their local count.
						func->LocalCount = ParseLocalArrayChunk(chunk, &func->LocalArrays, func->LocalCount + func->ArgCount) - func->ArgCount;
					}
				}
			}
		}

		// Load JUMP points
		chunk = (DWORD *)FindChunk (MAKE_ID('J','U','M','P'));
		if (chunk != NULL)
		{
			for (i = 0;i < (int)LittleLong(chunk[1]);i += 4)
				JumpPoints.Push(LittleLong(chunk[2 + i/4]));
		}

		// Initialize this object's map variables
		memset (MapVarStore, 0, sizeof(MapVarStore));
		chunk = (DWORD *)FindChunk (MAKE_ID('M','I','N','I'));
		while (chunk != NULL)
		{
			int numvars = LittleLong(chunk[1])/4 - 1;
			int firstvar = LittleLong(chunk[2]);
			for (i = 0; i < numvars; ++i)
			{
				MapVarStore[i+firstvar] = LittleLong(chunk[3+i]);
			}
			chunk = (DWORD *)NextChunk ((BYTE *)chunk);
		}

		// Initialize this object's map variable pointers to defaults. They can be changed
		// later once the imported modules are loaded.
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}

		// Create arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','R','A','Y'));
		if (chunk != NULL)
		{
			NumArrays = LittleLong(chunk[1])/8;
			ArrayStore = new ArrayInfo[NumArrays];
			memset (ArrayStore, 0, sizeof(*Arrays)*NumArrays);
			for (i = 0; i < NumArrays; ++i)
			{
				MapVarStore[LittleLong(chunk[2+i*2])] = i;
				ArrayStore[i].ArraySize = LittleLong(chunk[3+i*2]);
				ArrayStore[i].Elements = new SDWORD[ArrayStore[i].ArraySize];
				memset(ArrayStore[i].Elements, 0, ArrayStore[i].ArraySize*sizeof(DWORD));
			}
		}

		// Initialize arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','N','I'));
		while (chunk != NULL)
		{
			int arraynum = MapVarStore[LittleLong(chunk[2])];
			if ((unsigned)arraynum < (unsigned)NumArrays)
			{
				// Use unsigned iterator here to avoid issue with GCC 4.9/5.x
				// optimizer. Might be some undefined behavior in this code,
				// but I don't know what it is.
				unsigned int initsize = MIN<unsigned int> (ArrayStore[arraynum].ArraySize, (LittleLong(chunk[1])-4)/4);
				SDWORD *elems = ArrayStore[arraynum].Elements;
				for (unsigned int j = 0; j < initsize; ++j)
				{
					elems[j] = LittleLong(chunk[3+j]);
				}
			}
			chunk = (DWORD *)NextChunk((BYTE *)chunk);
		}

		// Start setting up array pointers
		NumTotalArrays = NumArrays;
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','M','P'));
		if (chunk != NULL)
		{
			NumTotalArrays += LittleLong(chunk[2]);
		}
		if (NumTotalArrays != 0)
		{
			Arrays = new ArrayInfo *[NumTotalArrays];
			for (i = 0; i < NumArrays; ++i)
			{
				Arrays[i] = &ArrayStore[i];
			}
		}

		// Tag the library ID to any map variables that are initialized with strings
		if (LibraryID != 0)
		{
			chunk = (DWORD *)FindChunk (MAKE_ID('M','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					const char *str = LookupString(MapVarStore[LittleLong(chunk[i+2])]);
					if (str != NULL)
					{
						MapVarStore[LittleLong(chunk[i+2])] = GlobalACSStrings.AddString(str);
					}
				}
			}

			chunk = (DWORD *)FindChunk (MAKE_ID('A','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					int arraynum = MapVarStore[LittleLong(chunk[i+2])];
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						for (int j = ArrayStore[arraynum].ArraySize; j > 0; --j, ++elems)
						{
//							*elems |= LibraryID;
							const char *str = LookupString(*elems);
							if (str != NULL)
							{
								*elems = GlobalACSStrings.AddString(str);
							}
						}
					}
				}
			}

			// [BL] Newer version of ASTR for structure aware compilers although we only have one array per chunk
			chunk = (DWORD *)FindChunk (MAKE_ID('A','T','A','G'));
			while (chunk != NULL)
			{
				const BYTE* chunkData = (const BYTE*)(chunk + 2);
				// First byte is version, it should be 0
				if(*chunkData++ == 0)
				{
					int arraynum = MapVarStore[uallong(LittleLong(*(const int*)(chunkData)))];
					chunkData += 4;
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						// Ending zeros may be left out.
						for (int j = MIN(LittleLong(chunk[1])-5, ArrayStore[arraynum].ArraySize); j > 0; --j, ++elems, ++chunkData)
						{
							// For ATAG, a value of 0 = Integer, 1 = String, 2 = FunctionPtr
							// Our implementation uses the same tags for both String and FunctionPtr
							if (*chunkData == 2)
							{
								*elems |= LibraryID;
							}
							else if (*chunkData == 1)
							{
								const char *str = LookupString(*elems);
								if (str != NULL)
								{
									*elems = GlobalACSStrings.AddString(str);
								}
							}
						}
					}
				}

				chunk = (DWORD *)NextChunk ((BYTE *)chunk);
			}
		}

		// Load required libraries.
		if (NULL != (chunk = (DWORD *)FindChunk (MAKE_ID('L','O','A','D'))))
		{
			const char *const parse = (char *)&chunk[2];
			DWORD i;

			for (i = 0; i < LittleLong(chunk[1]); )
			{
				if (parse[i])
				{
					FBehavior *module = NULL;
					int lump = Wads.CheckNumForName (&parse[i], ns_acslibrary);
					if (lump < 0)
					{
						Printf (TEXTCOLOR_RED "Could not find ACS library %s.\n", &parse[i]);
					}
					else
					{
						module = StaticLoadModule (lump);
					}
					if (module != NULL) Imports.Push (module);
					do {;} while (parse[++i]);
				}
				++i;
			}

			// Go through each imported module in order and resolve all imported functions
			// and map variables.
			for (i = 0; i < Imports.Size(); ++i)
			{
				FBehavior *lib = Imports[i];
				int j;

				if (lib == NULL)
					continue;

				// Resolve functions
				chunk = (DWORD *)FindChunk(MAKE_ID('F','N','A','M'));
				for (j = 0; j < NumFunctions; ++j)
				{
					ScriptFunction *func = &((ScriptFunction *)Functions)[j];
					if (func->Address == 0 && func->ImportNum == 0)
					{
						int libfunc = lib->FindFunctionName ((char *)(chunk + 2) + LittleLong(chunk[3+j]));
						if (libfunc >= 0)
						{
							ScriptFunction *realfunc = &((ScriptFunction *)lib->Functions)[libfunc];
							// Make sure that the library really defines this function. It might simply
							// be importing it itself.
							if (realfunc->Address != 0 && realfunc->ImportNum == 0)
							{
								func->Address = libfunc;
								func->ImportNum = i+1;
								if (realfunc->ArgCount != func->ArgCount)
								{
									Printf (TEXTCOLOR_ORANGE "Function %s in %s has %d arguments. %s expects it to have %d.\n",
										(char *)(chunk + 2) + LittleLong(chunk[3+j]), lib->ModuleName, realfunc->ArgCount,
										ModuleName, func->ArgCount);
									Format = ACS_Unknown;
								}
								// The next two properties do not affect code compatibility, so it is
								// okay for them to be different in the imported module than they are
								// in this one, as long as we make sure to use the real values.
								func->LocalCount = LittleLong(realfunc->LocalCount);
								func->HasReturnValue = realfunc->HasReturnValue;
							}
						}
					}
				}

				// Resolve map variables
				chunk = (DWORD *)FindChunk(MAKE_ID('M','I','M','P'));
				if (chunk != NULL)
				{
					char *parse = (char *)&chunk[2];
					for (DWORD j = 0; j < LittleLong(chunk[1]); )
					{
						DWORD varNum = LittleLong(*(DWORD *)&parse[j]);
						j += 4;
						int impNum = lib->FindMapVarName (&parse[j]);
						if (impNum >= 0)
						{
							MapVars[varNum] = &lib->MapVarStore[impNum];
						}
						do {;} while (parse[++j]);
						++j;
					}
				}

				// Resolve arrays
				if (NumTotalArrays > NumArrays)
				{
					chunk = (DWORD *)FindChunk(MAKE_ID('A','I','M','P'));
					char *parse = (char *)&chunk[3];
					for (DWORD j = 0; j < LittleLong(chunk[2]); ++j)
					{
						DWORD varNum = LittleLong(*(DWORD *)parse);
						parse += 4;
						DWORD expectedSize = LittleLong(*(DWORD *)parse);
						parse += 4;
						int impNum = lib->FindMapArray (parse);
						if (impNum >= 0)
						{
							Arrays[NumArrays + j] = &lib->ArrayStore[impNum];
							MapVarStore[varNum] = NumArrays + j;
							if (lib->ArrayStore[impNum].ArraySize != expectedSize)
							{
								Format = ACS_Unknown;
								Printf (TEXTCOLOR_ORANGE "The array %s in %s has %u elements, but %s expects it to only have %u.\n",
									parse, lib->ModuleName, lib->ArrayStore[impNum].ArraySize,
									ModuleName, expectedSize);
							}
						}
						do {;} while (*++parse);
						++parse;
					}
				}
			}
		}
	}

	DPrintf (DMSG_NOTIFY, "Loaded %d scripts, %d functions\n", NumScripts, NumFunctions);
	return true;
}